

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O2

void Int_ManWatchClause(Int_Man_t *p,Sto_Cls_t *pClause,lit Lit)

{
  Sto_Cls_t **ppSVar1;
  long lStack_10;
  
  if ((-1 < Lit) && ((int)((uint)Lit >> 1) < p->pCnf->nVars)) {
    if (*(int *)&pClause[1].pNext == Lit) {
      lStack_10 = 8;
    }
    else {
      if (*(int *)((long)&pClause[1].pNext + 4) != Lit) {
        __assert_fail("pClause->pLits[1] == Lit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                      ,0x18e,"void Int_ManWatchClause(Int_Man_t *, Sto_Cls_t *, lit)");
      }
      lStack_10 = 0x10;
    }
    ppSVar1 = p->pWatches;
    *(Sto_Cls_t **)((long)&pClause->pNext + lStack_10) = ppSVar1[Lit ^ 1U];
    ppSVar1[Lit ^ 1U] = pClause;
    return;
  }
  __assert_fail("lit_check(Lit, p->pCnf->nVars)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                ,0x189,"void Int_ManWatchClause(Int_Man_t *, Sto_Cls_t *, lit)");
}

Assistant:

static inline void Int_ManWatchClause( Int_Man_t * p, Sto_Cls_t * pClause, lit Lit )
{
    assert( lit_check(Lit, p->pCnf->nVars) );
    if ( pClause->pLits[0] == Lit )
        pClause->pNext0 = p->pWatches[lit_neg(Lit)];  
    else
    {
        assert( pClause->pLits[1] == Lit );
        pClause->pNext1 = p->pWatches[lit_neg(Lit)];  
    }
    p->pWatches[lit_neg(Lit)] = pClause;
}